

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hpack.cpp
# Opt level: O0

bool __thiscall HPack::Decoder::decodeSizeUpdate(Decoder *this,BitIStream *inputStream)

{
  bool bVar1;
  ulong uVar2;
  size_t in_RCX;
  void *in_RDX;
  BitIStream *in_RSI;
  FieldLookupTable *in_RDI;
  long in_FS_OFFSET;
  quint32 maxSize;
  BitIStream *in_stack_ffffffffffffffc8;
  undefined4 in_stack_ffffffffffffffd0;
  quint32 in_stack_ffffffffffffffd4;
  bool local_d;
  undefined4 local_c;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  local_c = 0;
  uVar2 = BitIStream::read(in_RSI,(int)&local_c,in_RDX,in_RCX);
  if ((uVar2 & 1) == 0) {
    handleStreamError((Decoder *)CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0),
                      in_stack_ffffffffffffffc8);
    local_d = false;
  }
  else {
    bVar1 = FieldLookupTable::updateDynamicTableSize(in_RDI,in_stack_ffffffffffffffd4);
    if (bVar1) {
      local_d = true;
    }
    else {
      local_d = false;
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return local_d;
  }
  __stack_chk_fail();
}

Assistant:

bool Decoder::decodeSizeUpdate(BitIStream &inputStream)
{
    // For now, just read and skip bits.
    quint32 maxSize = 0;
    if (inputStream.read(&maxSize)) {
        if (!lookupTable.updateDynamicTableSize(maxSize))
            return false;

        return true;
    }

    handleStreamError(inputStream);
    return false;
}